

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::assertionEnded(RunContext *this,AssertionResult *result)

{
  bool bVar1;
  OfType OVar2;
  uint uVar3;
  IStreamingReporter *pIVar4;
  allocator local_1b9;
  string local_1b8;
  string local_198;
  AssertionInfo local_178;
  AssertionStats local_110;
  AssertionResult *local_18;
  AssertionResult *result_local;
  RunContext *this_local;
  
  local_18 = result;
  result_local = (AssertionResult *)this;
  OVar2 = AssertionResult::getResultType(result);
  if (OVar2 == Ok) {
    (this->m_totals).assertions.passed = (this->m_totals).assertions.passed + 1;
  }
  else {
    bVar1 = AssertionResult::isOk(local_18);
    if (!bVar1) {
      (this->m_totals).assertions.failed = (this->m_totals).assertions.failed + 1;
    }
  }
  pIVar4 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  AssertionStats::AssertionStats(&local_110,local_18,&this->m_messages,&this->m_totals);
  uVar3 = (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[0xb])(pIVar4,&local_110);
  AssertionStats::~AssertionStats(&local_110);
  if ((uVar3 & 1) != 0) {
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear(&this->m_messages);
  }
  std::__cxx11::string::string((string *)&local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1b8,"{Unknown expression after the reported line}",&local_1b9);
  AssertionInfo::AssertionInfo
            (&local_178,&local_198,&(this->m_lastAssertionInfo).lineInfo,&local_1b8,
             (this->m_lastAssertionInfo).resultDisposition);
  AssertionInfo::operator=(&this->m_lastAssertionInfo,&local_178);
  AssertionInfo::~AssertionInfo(&local_178);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::__cxx11::string::~string((string *)&local_198);
  AssertionResult::operator=(&this->m_lastResult,local_18);
  return;
}

Assistant:

virtual void assertionEnded( AssertionResult const& result ) {
            if( result.getResultType() == ResultWas::Ok ) {
                m_totals.assertions.passed++;
            }
            else if( !result.isOk() ) {
                m_totals.assertions.failed++;
            }

            if( m_reporter->assertionEnded( AssertionStats( result, m_messages, m_totals ) ) )
                m_messages.clear();

            // Reset working state
            m_lastAssertionInfo = AssertionInfo( std::string(), m_lastAssertionInfo.lineInfo, "{Unknown expression after the reported line}" , m_lastAssertionInfo.resultDisposition );
            m_lastResult = result;
        }